

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall google::protobuf::internal::ExtensionSet::Has(ExtensionSet *this,int number)

{
  bool bVar1;
  pointer ppVar2;
  LogMessage *other;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  _Self local_30;
  _Self local_28;
  const_iterator iter;
  int number_local;
  ExtensionSet *this_local;
  
  iter._M_node._4_4_ = number;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::find(&this->extensions_,(key_type *)((long)&iter._M_node + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::end(&this->extensions_);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_28);
    local_69 = 0;
    if (((ppVar2->second).is_repeated & 1U) != 0) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0xb3);
      local_69 = 1;
      other = LogMessage::operator<<(&local_68,"CHECK failed: !iter->second.is_repeated: ");
      LogFinisher::operator=(local_7d,other);
    }
    if ((local_69 & 1) != 0) {
      LogMessage::~LogMessage(&local_68);
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_28);
    this_local._7_1_ = (bool)(((ppVar2->second).field_0xa & 0xf ^ 0xff) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool ExtensionSet::Has(int number) const {
  map<int, Extension>::const_iterator iter = extensions_.find(number);
  if (iter == extensions_.end()) return false;
  GOOGLE_DCHECK(!iter->second.is_repeated);
  return !iter->second.is_cleared;
}